

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int64_t mtree_atol(char **p,int base)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  
  if (base == 0) {
    pcVar2 = *p;
    base = 10;
    if (*pcVar2 == '0') {
      if ((byte)(pcVar2[1] | 0x20U) == 0x78) {
        *p = pcVar2 + 2;
        base = 0x10;
      }
      else {
        base = 8;
      }
    }
  }
  pcVar2 = *p;
  cVar1 = *pcVar2;
  iVar9 = (int)cVar1;
  uVar8 = CONCAT44(0,base);
  if (iVar9 == 0x2d) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(-0x8000000000000000),8);
    auVar4 = auVar3 << 0x40 | ZEXT816(0x8000000000000000);
    lVar5 = SUB168(auVar4 / SEXT816((long)uVar8),0);
    *p = pcVar2 + 1;
    cVar1 = pcVar2[1];
    iVar9 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      uVar7 = iVar9 - 0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      uVar7 = iVar9 - 0x61;
    }
    else {
      uVar7 = 0xffffffff;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        uVar7 = iVar9 - 0x41;
      }
    }
    if ((int)uVar7 < base && -1 < (int)uVar7) {
      lVar6 = 0;
      while( true ) {
        if (lVar6 < lVar5) {
          return -0x8000000000000000;
        }
        if ((lVar6 == lVar5) && (SUB164(auVar4 % SEXT816((long)uVar8),0) < (int)uVar7)) break;
        pcVar2 = *p;
        *p = pcVar2 + 1;
        cVar1 = pcVar2[1];
        iVar9 = (int)cVar1;
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar10 = iVar9 - 0x30;
        }
        else if ((byte)(cVar1 + 0x9fU) < 6) {
          uVar10 = iVar9 - 0x61;
        }
        else {
          uVar10 = iVar9 - 0x41;
          if (5 < (byte)(cVar1 + 0xbfU)) {
            uVar10 = 0xffffffff;
          }
        }
        lVar6 = lVar6 * uVar8 - (ulong)uVar7;
        if ((int)uVar10 < 0) {
          return lVar6;
        }
        uVar7 = uVar10;
        if (base <= (int)uVar10) {
          return lVar6;
        }
      }
      return -0x8000000000000000;
    }
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar8;
    auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
    lVar5 = SUB168(auVar3 / auVar4,0);
    if ((byte)(cVar1 - 0x30U) < 10) {
      uVar7 = iVar9 - 0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      uVar7 = iVar9 - 0x61;
    }
    else {
      uVar7 = 0xffffffff;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        uVar7 = iVar9 - 0x41;
      }
    }
    if ((int)uVar7 < base && -1 < (int)uVar7) {
      lVar6 = 0;
      while( true ) {
        if ((lVar5 < lVar6) || ((lVar6 == lVar5 && (SUB164(auVar3 % auVar4,0) < (int)uVar7)))) {
          return 0x7fffffffffffffff;
        }
        pcVar2 = *p;
        *p = pcVar2 + 1;
        cVar1 = pcVar2[1];
        iVar9 = (int)cVar1;
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar10 = iVar9 - 0x30;
        }
        else if ((byte)(cVar1 + 0x9fU) < 6) {
          uVar10 = iVar9 - 0x61;
        }
        else {
          uVar10 = iVar9 - 0x41;
          if (5 < (byte)(cVar1 + 0xbfU)) {
            uVar10 = 0xffffffff;
          }
        }
        lVar6 = (ulong)uVar7 + lVar6 * uVar8;
        if ((int)uVar10 < 0) break;
        uVar7 = uVar10;
        if (base <= (int)uVar10) {
          return lVar6;
        }
      }
      return lVar6;
    }
  }
  return 0;
}

Assistant:

static int64_t
mtree_atol(char **p, int base)
{
	int64_t l, limit;
	int digit, last_digit_limit;

	if (base == 0) {
		if (**p != '0')
			base = 10;
		else if ((*p)[1] == 'x' || (*p)[1] == 'X') {
			*p += 2;
			base = 16;
		} else {
			base = 8;
		}
	}

	if (**p == '-') {
		limit = INT64_MIN / base;
		last_digit_limit = INT64_MIN % base;
		++(*p);

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l < limit || (l == limit && digit > last_digit_limit))
				return INT64_MIN;
			l = (l * base) - digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	} else {
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l > limit || (l == limit && digit > last_digit_limit))
				return INT64_MAX;
			l = (l * base) + digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	}
}